

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::RandomOrderTexImage2DCase::RandomOrderTexImage2DCase
          (RandomOrderTexImage2DCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int width,int height)

{
  int numLevels;
  TransferFormat TVar1;
  deUint32 local_40;
  deUint32 dStack_3c;
  TransferFormat fmt;
  int width_local;
  deUint32 internalFormat_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  RandomOrderTexImage2DCase *this_local;
  
  fmt = (TransferFormat)glu::mapGLInternalFormat(internalFormat);
  numLevels = maxLevelCount(width,height);
  Texture2DSpecCase::Texture2DSpecCase
            (&this->super_Texture2DSpecCase,context,name,desc,(TextureFormat *)&fmt,width,height,
             numLevels);
  (this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__RandomOrderTexImage2DCase_01598600;
  *(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4 = internalFormat;
  this->m_format = 0;
  this->m_dataType = 0;
  TVar1 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  local_40 = TVar1.format;
  this->m_format = local_40;
  dStack_3c = TVar1.dataType;
  this->m_dataType = dStack_3c;
  return;
}

Assistant:

RandomOrderTexImage2DCase (Context& context, const char* name, const char* desc, deUint32 internalFormat, int width, int height)
		: Texture2DSpecCase	(context, name, desc, glu::mapGLInternalFormat(internalFormat), width, height, maxLevelCount(width, height))
		, m_internalFormat	(internalFormat)
		, m_format			(GL_NONE)
		, m_dataType		(GL_NONE)
	{
		glu::TransferFormat fmt = glu::getTransferFormat(m_texFormat);
		m_format	= fmt.format;
		m_dataType	= fmt.dataType;
	}